

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::FindNextProperty
          (SimpleTypeHandler<2UL> *this,ScriptContext *scriptContext,PropertyIndex *index,
          JavascriptString **propertyStringName,PropertyId *propertyId,
          PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
          EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  int iVar1;
  PropertyId propertyId_00;
  PropertyRecord *pPVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  PropertyString *this_00;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyIndex PVar7;
  ushort uVar8;
  byte bVar9;
  
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x138,"(propertyStringName)","propertyStringName");
    if (!bVar4) goto LAB_00cbe5cb;
    *puVar6 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x139,"(propertyId)","propertyId");
    if (!bVar4) goto LAB_00cbe5cb;
    *puVar6 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x13a,"(type)","type");
    if (!bVar4) {
LAB_00cbe5cb:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  iVar1 = this->propertyCount;
  uVar8 = *index;
  do {
    if (iVar1 <= (int)(uint)uVar8) {
      BVar5 = 0;
joined_r0x00cbe51b:
      if (info != (PropertyValueInfo *)0x0) {
        PVar7 = 0xffff;
        bVar9 = 0;
LAB_00cbe524:
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = PVar7;
        info->m_attributes = bVar9;
        info->flags = InlineCacheNoFlags;
      }
      return BVar5;
    }
    bVar9 = this->descriptors[uVar8].field_1.Attributes;
    if ((((bVar9 & 8) == 0) && (((flags & EnumNonEnumerable) != None || ((bVar9 & 1) != 0)))) &&
       ((pPVar2 = this->descriptors[uVar8].Id.ptr, (flags & EnumSymbols) != None ||
        (pPVar2->isSymbol == false)))) {
      if (attributes != (PropertyAttributes *)0x0) {
        *attributes = bVar9;
      }
      propertyId_00 = pPVar2->pid;
      *propertyId = propertyId_00;
      this_00 = ScriptContext::GetPropertyString(scriptContext,propertyId_00);
      *propertyStringName = &this_00->super_JavascriptString;
      polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_00);
      PropertyValueInfo::SetCacheInfo<Js::PropertyString>(info,this_00,polymorphicInlineCache,false)
      ;
      if (((DynamicType *)type != typeToEnumerate) || ((bVar9 & 4) == 0)) {
        BVar5 = 1;
        goto joined_r0x00cbe51b;
      }
      if (info == (PropertyValueInfo *)0x0) {
        return 1;
      }
      PVar7 = *index;
      BVar5 = 1;
      goto LAB_00cbe524;
    }
    uVar8 = uVar8 + 1;
    *index = uVar8;
  } while( true );
}

Assistant:

BOOL SimpleTypeHandler<size>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);

        for( ; index < propertyCount; ++index )
        {
            PropertyAttributes attribs = descriptors[index].Attributes;
            if( !(attribs & PropertyDeleted) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (attribs & PropertyEnumerable)))
            {
                const PropertyRecord* propertyRecord = descriptors[index].Id;

                // Skip this property if it is a symbol and we are not including symbol properties
                if (!(flags & EnumeratorFlags::EnumSymbols) && propertyRecord->IsSymbol())
                {
                    continue;
                }

                if (attributes != nullptr)
                {
                    *attributes = attribs;
                }

                *propertyId = propertyRecord->GetPropertyId();
                PropertyString * propStr = scriptContext->GetPropertyString(*propertyId);
                *propertyStringName = propStr;

                PropertyValueInfo::SetCacheInfo(info, propStr, propStr->GetLdElemInlineCache(), false);
                if ((attribs & PropertyWritable) == PropertyWritable && type == typeToEnumerate)
                {
                    PropertyValueInfo::Set(info, instance, index, attribs);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }